

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

Vector3d * __thiscall VCClusterAniso::center(VCClusterAniso *this,Matrix3d *sumK,Vector3d *sumKPos)

{
  bool *in_RDX;
  CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>
  *in_RDI;
  double det;
  Matrix3d sumKInv;
  bool valid;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff40;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_ffffffffffffff48;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_ffffffffffffff50;
  Scalar *in_stack_ffffffffffffff58;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_ffffffffffffff60;
  undefined1 local_21;
  
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x27f2bd);
  Eigen::NumTraits<double>::dummy_precision();
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::
  computeInverseAndDetWithCheck<Eigen::Matrix<double,3,3,0,3,3>>
            (in_stack_ffffffffffffff50,(Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffff48,
             (Scalar *)in_stack_ffffffffffffff40,in_RDX,(RealScalar *)in_RDI);
  if ((local_21 & 1) == 0) {
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (Scalar *)in_stack_ffffffffffffff50,(Scalar *)in_stack_ffffffffffffff48);
  }
  else {
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    Eigen::CoeffBasedProduct::operator_cast_to_Matrix_(in_RDI);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffff50,
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffff48);
  }
  return (Vector3d *)in_RDI;
}

Assistant:

Vector3d VCClusterAniso::center(const Matrix3d& sumK, const Vector3d &sumKPos)
{
	bool valid;
	Matrix3d sumKInv;
	double det;
	sumK.computeInverseAndDetWithCheck(sumKInv, det, valid);
	if (!valid) {
		return Vector3d(0, 0, 0);
	}
	return sumKInv * sumKPos;
}